

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  int64_t iVar4;
  long lVar5;
  int iVar6;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  
  iVar6 = 0;
  bVar3 = OverlapInLevel(this,0,smallest_user_key,largest_user_key);
  if (!bVar3) {
    InternalKey::InternalKey(&start,smallest_user_key,0xffffffffffffff,kTypeValue);
    InternalKey::InternalKey(&limit,largest_user_key,0,kTypeDeletion);
    overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar2 = 0;
    do {
      iVar6 = iVar2;
      if (iVar6 == 2) break;
      bVar3 = OverlapInLevel(this,iVar6 + 1,smallest_user_key,largest_user_key);
      if (bVar3) break;
      GetOverlappingInputs(this,iVar6 + 2,&start,&limit,&overlaps);
      iVar4 = TotalFileSize(&overlaps);
      sVar1 = this->vset_->options_->max_file_size;
      lVar5 = sVar1 * 10;
      iVar2 = iVar6 + 1;
    } while (iVar4 == lVar5 || SBORROW8(iVar4,lVar5) != (long)(iVar4 + sVar1 * -10) < 0);
    std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
    ~_Vector_base(&overlaps.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 );
    std::__cxx11::string::~string((string *)&limit);
    std::__cxx11::string::~string((string *)&start);
  }
  return iVar6;
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}